

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GTIN.cpp
# Opt level: O2

string * ZXing::GTIN::Price(string *__return_storage_ptr__,string *ean5AddOn)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  ostream *this;
  string currency;
  stringstream buf;
  ostream local_190 [376];
  
  if (ean5AddOn->_M_string_length != 5) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  currency._M_dataplus._M_p = (pointer)&currency.field_2;
  currency._M_string_length = 0;
  currency.field_2._M_local_buf[0] = '\0';
  switch(*(ean5AddOn->_M_dataplus)._M_p) {
  case '0':
  case '1':
    break;
  case '3':
    break;
  case '4':
    break;
  case '5':
    break;
  case '6':
    break;
  case '9':
    bVar3 = std::operator==(ean5AddOn,"90000");
    if (bVar3) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      goto LAB_001511c8;
    }
    bVar3 = std::operator==(ean5AddOn,"99991");
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"0.00",(allocator<char> *)&buf);
      goto LAB_001511c8;
    }
    bVar3 = std::operator==(ean5AddOn,"99990");
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"Used",(allocator<char> *)&buf);
      goto LAB_001511c8;
    }
  default:
  }
  std::__cxx11::string::assign((char *)&currency);
  std::__cxx11::string::substr((ulong)&buf,(ulong)ean5AddOn);
  iVar4 = std::__cxx11::stoi((string *)&buf,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&buf);
  std::__cxx11::stringstream::stringstream((stringstream *)&buf);
  this = std::operator<<(local_190,(string *)&currency);
  lVar1 = *(long *)this;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(this + lVar2 + 0x18) = *(uint *)(this + lVar2 + 0x18) & 0xfffffefb | 4;
  *(undefined8 *)(this + *(long *)(lVar1 + -0x18) + 8) = 2;
  std::ostream::operator<<(this,(float)iVar4 / 100.0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&buf);
LAB_001511c8:
  std::__cxx11::string::~string((string *)&currency);
  return __return_storage_ptr__;
}

Assistant:

std::string Price(const std::string& ean5AddOn)
{
	if (ean5AddOn.size() != 5)
		return {};

	std::string currency;
	switch (ean5AddOn.front()) {
	case '0': [[fallthrough]];
	case '1': currency = "GBP £"; break; // UK
	case '3': currency = "AUD $"; break; // AUS
	case '4': currency = "NZD $"; break; // NZ
	case '5': currency = "USD $"; break; // US
	case '6': currency = "CAD $"; break; // CA
	case '9':
		// Reference: http://www.jollytech.com
		if (ean5AddOn == "90000") // No suggested retail price
			return {};
		if (ean5AddOn == "99991") // Complementary
			return "0.00";
		if (ean5AddOn == "99990")
			return "Used";

		// Otherwise... unknown currency?
		currency = "";
		break;
	default: currency = ""; break;
	}

	int rawAmount = std::stoi(ean5AddOn.substr(1));
	std::stringstream buf;
	buf << currency << std::fixed << std::setprecision(2) << (float(rawAmount) / 100);
	return buf.str();
}